

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O0

void P_AutoUseStrifeHealth(player_t *player)

{
  long *plVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  AInventory **ppAVar5;
  uint local_44;
  uint local_40;
  uint i;
  int index;
  int maxhealth;
  int mode;
  AInventory *local_28;
  AInventory *inv;
  TArray<AInventory_*,_AInventory_*> Items;
  player_t *player_local;
  
  Items._8_8_ = player;
  TArray<AInventory_*,_AInventory_*>::TArray((TArray<AInventory_*,_AInventory_*> *)&inv);
  for (local_28 = TObjPtr::operator_cast_to_AInventory_((TObjPtr *)(*(long *)Items._8_8_ + 0x3b0));
      local_28 != (AInventory *)0x0;
      local_28 = TObjPtr::operator_cast_to_AInventory_
                           ((TObjPtr *)&(local_28->super_AActor).Inventory)) {
    if (((0 < local_28->Amount) &&
        (bVar2 = DObject::IsKindOf((DObject *)local_28,AHealthPickup::RegistrationInfo.MyClass),
        bVar2)) && (*(int *)&local_28->field_0x4fc == 3)) {
      TArray<AInventory_*,_AInventory_*>::Push((TArray<AInventory_*,_AInventory_*> *)&inv,&local_28)
      ;
    }
  }
  bVar2 = FBoolCVar::operator_cast_to_bool(&sv_disableautohealth);
  if (!bVar2) {
    while (uVar4 = TArray<AInventory_*,_AInventory_*>::Size
                             ((TArray<AInventory_*,_AInventory_*> *)&inv), uVar4 != 0) {
      i = 0;
      local_40 = 0xffffffff;
      for (local_44 = 0;
          uVar4 = TArray<AInventory_*,_AInventory_*>::Size
                            ((TArray<AInventory_*,_AInventory_*> *)&inv), local_44 < uVar4;
          local_44 = local_44 + 1) {
        ppAVar5 = TArray<AInventory_*,_AInventory_*>::operator[]
                            ((TArray<AInventory_*,_AInventory_*> *)&inv,(ulong)local_44);
        if ((int)i < ((*ppAVar5)->super_AActor).health) {
          local_40 = local_44;
          ppAVar5 = TArray<AInventory_*,_AInventory_*>::operator[]
                              ((TArray<AInventory_*,_AInventory_*> *)&inv,(ulong)local_44);
          i = (*ppAVar5)->Amount;
        }
      }
      do {
        if (0x31 < *(int *)(Items._8_8_ + 0x98)) break;
        plVar1 = *(long **)Items._8_8_;
        ppAVar5 = TArray<AInventory_*,_AInventory_*>::operator[]
                            ((TArray<AInventory_*,_AInventory_*> *)&inv,(long)(int)local_40);
        bVar3 = (**(code **)(*plVar1 + 0xb8))(plVar1,*ppAVar5);
      } while ((bVar3 & 1) != 0);
      if (0x31 < *(int *)(Items._8_8_ + 0x98)) break;
      TArray<AInventory_*,_AInventory_*>::Delete
                ((TArray<AInventory_*,_AInventory_*> *)&inv,local_40);
    }
  }
  TArray<AInventory_*,_AInventory_*>::~TArray((TArray<AInventory_*,_AInventory_*> *)&inv);
  return;
}

Assistant:

void P_AutoUseStrifeHealth (player_t *player)
{
	TArray<AInventory *> Items;

	for(AInventory *inv = player->mo->Inventory; inv != NULL; inv = inv->Inventory)
	{
		if (inv->Amount > 0 && inv->IsKindOf(RUNTIME_CLASS(AHealthPickup)))
		{
			int mode = static_cast<AHealthPickup*>(inv)->autousemode;

			if (mode == 3) Items.Push(inv);
		}
	}

	if (!sv_disableautohealth)
	{
		while (Items.Size() > 0)
		{
			int maxhealth = 0;
			int index = -1;

			// Find the largest item in the list
			for(unsigned i = 0; i < Items.Size(); i++)
			{
				if (Items[i]->health > maxhealth)
				{
					index = i;
					maxhealth = Items[i]->Amount;
				}
			}

			while (player->health < 50)
			{
				if (!player->mo->UseInventory (Items[index]))
					break;
			}
			if (player->health >= 50) return;
			// Using all of this item was not enough so delete it and restart with the next best one
			Items.Delete(index);
		}
	}
}